

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O0

void __thiscall Vector::Normalize(Vector *this)

{
  float fVar1;
  float fVar2;
  float l;
  Vector *this_local;
  
  fVar1 = Length(this);
  fVar1 = 1.0 / fVar1;
  fVar2 = X(this);
  SetX(this,fVar2 * fVar1);
  fVar2 = Y(this);
  SetY(this,fVar2 * fVar1);
  fVar2 = Z(this);
  SetZ(this,fVar2 * fVar1);
  this->m_length = 1.0;
  return;
}

Assistant:

void Normalize()
	{
	   float l = 1.f / Length();

	   SetX(X() * l);
	   SetY(Y() * l);
	   SetZ(Z() * l);
	   m_length=1.0f;
	}